

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamWriterPrivate::writeStartElement
          (QXmlStreamWriterPrivate *this,QAnyStringView namespaceUri,QAnyStringView name,
          StartElementOption option)

{
  QString *pQVar1;
  qsizetype qVar2;
  QString *pQVar3;
  qsizetype qVar4;
  QAnyStringView s;
  bool bVar5;
  Tag *pTVar6;
  NamespaceDeclaration *__n;
  const_pointer str;
  qsizetype qVar7;
  qsizetype in_RCX;
  int *piVar8;
  QString *in_RDX;
  qsizetype in_RSI;
  QXmlStreamWriterPrivate *in_RDI;
  qsizetype in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  QAnyStringView in_stack_00000030;
  qsizetype i;
  Tag *tag;
  QXmlStreamPrivateTagStack *in_stack_fffffffffffffea0;
  int *len;
  QChar *in_stack_fffffffffffffea8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffec0;
  int level;
  QXmlStreamWriterPrivate *in_stack_fffffffffffffec8;
  QXmlStreamPrivateTagStack *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  long local_108;
  QXmlStreamWriterPrivate *pQVar9;
  undefined2 uVar10;
  QXmlStreamWriterPrivate *in_stack_ffffffffffffff18;
  NamespaceDeclaration *namespaceDeclaration;
  QXmlStreamWriterPrivate *in_stack_ffffffffffffff48;
  int local_a8 [2];
  void *local_a0;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_98;
  void *local_90;
  int local_88 [2];
  void *local_80;
  NamespaceDeclaration local_78;
  QString *local_40;
  qsizetype qStack_38;
  qsizetype local_30;
  qsizetype local_28;
  qsizetype qStack_20;
  qsizetype local_18;
  QString *pQStack_10;
  long local_8;
  
  level = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = in_RDI;
  local_28 = in_RCX;
  qStack_20 = in_R8;
  local_18 = in_RSI;
  pQStack_10 = in_RDX;
  bVar5 = finishStartElement((QXmlStreamWriterPrivate *)in_stack_fffffffffffffee0.m_data,
                             SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0));
  uVar10 = (undefined2)((ulong)pQVar9 >> 0x30);
  if ((!bVar5) && ((*(ushort *)&in_RDI->field_0x78 >> 7 & 1) != 0)) {
    QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag>::size
              (&(in_RDI->super_QXmlStreamPrivateTagStack).tagStack);
    indent(in_stack_fffffffffffffec8,level);
  }
  pTVar6 = QXmlStreamPrivateTagStack::tagStack_push(in_stack_fffffffffffffea0);
  local_78.namespaceUri.m_pos = local_28;
  local_78.namespaceUri.m_size = qStack_20;
  s.m_size = in_stack_fffffffffffffee8;
  s.field_0.m_data = in_stack_fffffffffffffee0.m_data;
  QXmlStreamPrivateTagStack::addToStringStorage(in_stack_fffffffffffffed0,s);
  (pTVar6->name).m_size = local_30;
  (pTVar6->name).m_string = local_40;
  (pTVar6->name).m_pos = qStack_38;
  local_78.prefix.m_size = local_18;
  local_78.namespaceUri.m_string = pQStack_10;
  __n = findNamespace(in_stack_ffffffffffffff18,in_stack_00000030,SUB21((ushort)uVar10 >> 8,0),
                      SUB21(uVar10,0));
  pQVar1 = (__n->prefix).m_string;
  qVar7 = (__n->prefix).m_pos;
  qVar2 = (__n->prefix).m_size;
  pQVar3 = (__n->namespaceUri).m_string;
  qVar4 = (__n->namespaceUri).m_size;
  (pTVar6->namespaceDeclaration).namespaceUri.m_pos = (__n->namespaceUri).m_pos;
  (pTVar6->namespaceDeclaration).namespaceUri.m_size = qVar4;
  (pTVar6->namespaceDeclaration).prefix.m_size = qVar2;
  (pTVar6->namespaceDeclaration).namespaceUri.m_string = pQVar3;
  (pTVar6->namespaceDeclaration).prefix.m_string = pQVar1;
  (pTVar6->namespaceDeclaration).prefix.m_pos = qVar7;
  namespaceDeclaration = &local_78;
  std::data<char_const,2ul>((char (*) [2])0xa1c4a7);
  QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64f7b4);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8,
             (qsizetype)in_stack_fffffffffffffea0);
  write(in_RDI,(int)local_78.prefix.m_string,(void *)local_78.prefix.m_pos,(size_t)__n);
  bVar5 = QtPrivate::XmlStringRef::isEmpty(&(pTVar6->namespaceDeclaration).prefix);
  if (!bVar5) {
    piVar8 = local_88;
    std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x64f846);
    QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x64f858);
    QAnyStringView::QAnyStringView<QChar,_true>
              ((QAnyStringView *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (qsizetype)in_stack_fffffffffffffea0);
    write(in_RDI,local_88[0],local_80,(size_t)piVar8);
    in_stack_fffffffffffffeb0 = &local_98;
    in_stack_ffffffffffffff48 = (QXmlStreamWriterPrivate *)0x93f6e5;
    std::data<char_const,2ul>((char (*) [2])0x93f6e5);
    QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64f8dd);
    QAnyStringView::QAnyStringView<char,_true>
              ((QAnyStringView *)in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8,
               (qsizetype)in_stack_fffffffffffffea0);
    write(in_RDI,local_98._0_4_,local_90,(size_t)piVar8);
  }
  piVar8 = local_a8;
  len = piVar8;
  str = std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x64f955);
  QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x64f967);
  QAnyStringView::QAnyStringView<QChar,_true>
            ((QAnyStringView *)in_stack_fffffffffffffeb0,str,(qsizetype)len);
  write(in_RDI,local_a8[0],local_a0,(size_t)piVar8);
  *(ushort *)&in_RDI->field_0x78 = *(ushort *)&in_RDI->field_0x78 & 0xfff7 | 8;
  *(ushort *)&in_RDI->field_0x78 = *(ushort *)&in_RDI->field_0x78 & 0xfffd | 2;
  if (in_R9D != 1) {
    for (local_108 = in_RDI->lastNamespaceDeclaration;
        qVar7 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::size
                          ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *
                           )in_RDI), local_108 < qVar7; local_108 = local_108 + 1) {
      QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::operator[]
                ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)in_RDI,
                 local_108);
      writeNamespaceDeclaration(in_stack_ffffffffffffff48,namespaceDeclaration);
    }
  }
  pTVar6->namespaceDeclarationsSize = in_RDI->lastNamespaceDeclaration;
  in_RDI->field_0x79 = in_RDI->field_0x79 | 2;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXmlStreamWriterPrivate::writeStartElement(QAnyStringView namespaceUri, QAnyStringView name,
                                                StartElementOption option)
{
    if (!finishStartElement(false) && autoFormatting)
        indent(tagStack.size());

    Tag &tag = tagStack_push();
    tag.name = addToStringStorage(name);
    tag.namespaceDeclaration = findNamespace(namespaceUri);
    write("<");
    if (!tag.namespaceDeclaration.prefix.isEmpty()) {
        write(tag.namespaceDeclaration.prefix);
        write(":");
    }
    write(tag.name);
    inStartElement = lastWasStartElement = true;

    if (option != StartElementOption::OmitNamespaceDeclarations) {
        for (qsizetype i = lastNamespaceDeclaration; i < namespaceDeclarations.size(); ++i)
            writeNamespaceDeclaration(namespaceDeclarations[i]);
    }
    tag.namespaceDeclarationsSize = lastNamespaceDeclaration;
    didWriteAnyToken = true;
}